

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_header_parser.cc
# Opt level: O0

void __thiscall vp9_parser::Vp9HeaderParser::ParseTileInfo(Vp9HeaderParser *this)

{
  int iVar1;
  bool bVar2;
  int local_54;
  int local_50;
  int log2_tile_rows;
  int log2_tile_cols;
  int max_ones;
  int min_log2_tile_cols;
  int max_log2_tile_cols;
  int max_log2_n_tiles;
  int min_log2_n_tiles;
  int sb_cols;
  int aligned_mi_cols;
  int mi_cols;
  int aligned_width;
  bool segmentation_enabled;
  int i_1;
  int kMaxModeDeltas;
  int i;
  int kMaxRefLFDeltas;
  bool mode_ref_delta_update;
  bool mode_ref_delta_enabled;
  Vp9HeaderParser *this_local;
  
  VpxReadLiteral(this,2);
  VpxReadLiteral(this,6);
  VpxReadLiteral(this,3);
  iVar1 = ReadBit(this);
  if ((iVar1 != 0) && (iVar1 = ReadBit(this), iVar1 != 0)) {
    for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
      iVar1 = ReadBit(this);
      if (iVar1 != 0) {
        VpxReadLiteral(this,7);
      }
    }
    for (aligned_width = 0; aligned_width < 2; aligned_width = aligned_width + 1) {
      iVar1 = ReadBit(this);
      if (iVar1 != 0) {
        VpxReadLiteral(this,7);
      }
    }
  }
  VpxReadLiteral(this,8);
  SkipDeltaQ(this);
  SkipDeltaQ(this);
  SkipDeltaQ(this);
  iVar1 = ReadBit(this);
  if (iVar1 == 0) {
    iVar1 = AlignPowerOfTwo(this,this->width_,3);
    iVar1 = AlignPowerOfTwo(this,iVar1 >> 3,3);
    for (min_log2_tile_cols = 0; 3 < (iVar1 >> 3) >> ((byte)min_log2_tile_cols & 0x1f);
        min_log2_tile_cols = min_log2_tile_cols + 1) {
    }
    min_log2_tile_cols = min_log2_tile_cols + -1;
    if (min_log2_tile_cols < 0) {
      min_log2_tile_cols = 0;
    }
    for (max_log2_tile_cols = 0; 0x40 << ((byte)max_log2_tile_cols & 0x1f) < iVar1 >> 3;
        max_log2_tile_cols = max_log2_tile_cols + 1) {
    }
    local_50 = max_log2_tile_cols;
    log2_tile_rows = min_log2_tile_cols - max_log2_tile_cols;
    while( true ) {
      bVar2 = false;
      if (log2_tile_rows != 0) {
        iVar1 = ReadBit(this);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      local_50 = local_50 + 1;
      log2_tile_rows = log2_tile_rows + -1;
    }
    local_54 = ReadBit(this);
    if (local_54 != 0) {
      iVar1 = ReadBit(this);
      local_54 = iVar1 + local_54;
    }
    this->row_tiles_ = 1 << ((byte)local_54 & 0x1f);
    this->column_tiles_ = 1 << ((byte)local_50 & 0x1f);
  }
  return;
}

Assistant:

void Vp9HeaderParser::ParseTileInfo() {
  VpxReadLiteral(2);  // Consume frame context index

  // loopfilter
  VpxReadLiteral(6);  // Consume filter level
  VpxReadLiteral(3);  // Consume sharpness level

  const bool mode_ref_delta_enabled = ReadBit();
  if (mode_ref_delta_enabled) {
    const bool mode_ref_delta_update = ReadBit();
    if (mode_ref_delta_update) {
      const int kMaxRefLFDeltas = 4;
      for (int i = 0; i < kMaxRefLFDeltas; ++i) {
        if (ReadBit())
          VpxReadLiteral(7);  // Consume ref_deltas + sign
      }

      const int kMaxModeDeltas = 2;
      for (int i = 0; i < kMaxModeDeltas; ++i) {
        if (ReadBit())
          VpxReadLiteral(7);  // Consume mode_delta + sign
      }
    }
  }

  // quantization
  VpxReadLiteral(8);  // Consume base_q
  SkipDeltaQ();  // y dc
  SkipDeltaQ();  // uv ac
  SkipDeltaQ();  // uv dc

  // segmentation
  const bool segmentation_enabled = ReadBit();
  if (!segmentation_enabled) {
    const int aligned_width = AlignPowerOfTwo(width_, kMiSizeLog2);
    const int mi_cols = aligned_width >> kMiSizeLog2;
    const int aligned_mi_cols = AlignPowerOfTwo(mi_cols, kMiSizeLog2);
    const int sb_cols = aligned_mi_cols >> 3;  // to_sbs(mi_cols);
    int min_log2_n_tiles, max_log2_n_tiles;

    for (max_log2_n_tiles = 0;
         (sb_cols >> max_log2_n_tiles) >= kMinTileWidthB64;
         max_log2_n_tiles++) {
    }
    max_log2_n_tiles--;
    if (max_log2_n_tiles < 0)
      max_log2_n_tiles = 0;

    for (min_log2_n_tiles = 0; (kMaxTileWidthB64 << min_log2_n_tiles) < sb_cols;
         min_log2_n_tiles++) {
    }

    // columns
    const int max_log2_tile_cols = max_log2_n_tiles;
    const int min_log2_tile_cols = min_log2_n_tiles;
    int max_ones = max_log2_tile_cols - min_log2_tile_cols;
    int log2_tile_cols = min_log2_tile_cols;
    while (max_ones-- && ReadBit())
      log2_tile_cols++;

    // rows
    int log2_tile_rows = ReadBit();
    if (log2_tile_rows)
      log2_tile_rows += ReadBit();

    row_tiles_ = 1 << log2_tile_rows;
    column_tiles_ = 1 << log2_tile_cols;
  }
}